

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

ProcessInfo
llvm::sys::ExecuteNoWait
          (StringRef Program,ArrayRef<llvm::StringRef> Args,
          Optional<llvm::ArrayRef<llvm::StringRef>_> Env,
          ArrayRef<llvm::Optional<llvm::StringRef>_> Redirects,uint MemoryLimit,string *ErrMsg,
          bool *ExecutionFailed)

{
  ArrayRef<llvm::Optional<llvm::StringRef>_> Redirects_00;
  ProcessInfo PVar1;
  ArrayRef<llvm::StringRef> Args_00;
  StringRef Program_00;
  bool bVar2;
  size_t sVar3;
  bool local_a9;
  undefined1 local_50 [8];
  ArrayRef<llvm::Optional<llvm::StringRef>_> Redirects_local;
  ArrayRef<llvm::StringRef> Args_local;
  StringRef Program_local;
  undefined4 uStack_18;
  ProcessInfo PI;
  
  Redirects_local.Data = (Optional<llvm::StringRef> *)Redirects.Length;
  local_50 = (undefined1  [8])Redirects.Data;
  Redirects_local.Length = (size_type)Args.Data;
  Program_local.Data = (char *)Program.Length;
  bVar2 = ArrayRef<llvm::Optional<llvm::StringRef>_>::empty
                    ((ArrayRef<llvm::Optional<llvm::StringRef>_> *)local_50);
  local_a9 = true;
  if (!bVar2) {
    sVar3 = ArrayRef<llvm::Optional<llvm::StringRef>_>::size
                      ((ArrayRef<llvm::Optional<llvm::StringRef>_> *)local_50);
    local_a9 = sVar3 == 3;
  }
  if (local_a9) {
    ProcessInfo::ProcessInfo((ProcessInfo *)((long)&Program_local.Length + 4));
    if (ExecutionFailed != (bool *)0x0) {
      *ExecutionFailed = false;
    }
    Program_00.Length = (size_t)Program_local.Data;
    Program_00.Data = Program.Data;
    Args_00.Length = Args.Length;
    Args_00.Data = (StringRef *)Redirects_local.Length;
    Redirects_00.Length = (size_type)Redirects_local.Data;
    Redirects_00.Data = (Optional<llvm::StringRef> *)local_50;
    bVar2 = Execute((ProcessInfo *)((long)&Program_local.Length + 4),Program_00,Args_00,Env,
                    Redirects_00,MemoryLimit,ErrMsg);
    if ((!bVar2) && (ExecutionFailed != (bool *)0x0)) {
      *ExecutionFailed = true;
    }
    PVar1.ReturnCode = PI.Pid;
    PVar1.Pid = Program_local.Length._4_4_;
    PVar1.Process = uStack_18;
    return PVar1;
  }
  __assert_fail("Redirects.empty() || Redirects.size() == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Program.cpp"
                ,0x39,
                "ProcessInfo llvm::sys::ExecuteNoWait(StringRef, ArrayRef<StringRef>, Optional<ArrayRef<StringRef>>, ArrayRef<Optional<StringRef>>, unsigned int, std::string *, bool *)"
               );
}

Assistant:

ProcessInfo sys::ExecuteNoWait(StringRef Program, ArrayRef<StringRef> Args,
                               Optional<ArrayRef<StringRef>> Env,
                               ArrayRef<Optional<StringRef>> Redirects,
                               unsigned MemoryLimit, std::string *ErrMsg,
                               bool *ExecutionFailed) {
  assert(Redirects.empty() || Redirects.size() == 3);
  ProcessInfo PI;
  if (ExecutionFailed)
    *ExecutionFailed = false;
  if (!Execute(PI, Program, Args, Env, Redirects, MemoryLimit, ErrMsg))
    if (ExecutionFailed)
      *ExecutionFailed = true;

  return PI;
}